

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
reserve(InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
        *this,size_t n)

{
  size_t sVar1;
  Point3<float> *pPVar2;
  iterator pPVar3;
  ulong in_RSI;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  *in_RDI;
  int i;
  Point3<float> *ra;
  Point3<float> *in_stack_ffffffffffffffc8;
  Point3<float> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  sVar1 = capacity(in_RDI);
  if (sVar1 < in_RSI) {
    pPVar2 = pstd::pmr::polymorphic_allocator<pbrt::Point3<float>>::
             allocate_object<pbrt::Point3<float>>
                       ((polymorphic_allocator<pbrt::Point3<float>_> *)in_stack_ffffffffffffffd0,
                        (size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pPVar2 + local_1c;
      pPVar3 = begin(in_RDI);
      pstd::pmr::polymorphic_allocator<pbrt::Point3<float>>::
      construct<pbrt::Point3<float>,pbrt::Point3<float>>
                ((polymorphic_allocator<pbrt::Point3<float>> *)in_RDI,in_stack_ffffffffffffffd0,
                 pPVar3 + local_1c);
      pPVar3 = begin(in_RDI);
      pstd::pmr::polymorphic_allocator<pbrt::Point3<float>>::destroy<pbrt::Point3<float>>
                ((polymorphic_allocator<pbrt::Point3<float>> *)in_RDI,pPVar3 + local_1c);
    }
    pstd::pmr::polymorphic_allocator<pbrt::Point3<float>>::deallocate_object<pbrt::Point3<float>>
              ((polymorphic_allocator<pbrt::Point3<float>_> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8,0x4fa8ae);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pPVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }